

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O3

void serialization::
     unserialize_unpack<char_const*const*&,serialization::json_iarchive,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&>
               (char ***arg,json_iarchive *ar,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *front)

{
  char *key;
  size_type sVar1;
  size_type i;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  key = **arg;
  json_iarchive::load_key_start(ar,key);
  sVar1 = json_iarchive::load_sequence_start(ar);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::reserve(front,(ulong)sVar1);
  if (sVar1 != 0) {
    i = 0;
    do {
      json_iarchive::load_sequence_item_start(ar,i);
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      unserialize_helper<serialization::json_iarchive,std::vector<int,std::allocator<int>>>
                (ar,&local_48);
      std::
      vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
      ::
      emplace_back<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                ((vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
                  *)front,&local_48);
      json_iarchive::load_sequence_item_end(ar);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      i = i + 1;
    } while (sVar1 != i);
  }
  json_iarchive::load_key_end(ar,key);
  *arg = *arg + 1;
  return;
}

Assistant:

inline void unserialize_unpack(Argument && arg, const Archive & ar, T && front, Args&& ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.load_key_start(key);
    unserialize_helper(ar, front);
    ar.load_key_end(key);

    unserialize_unpack(++arg, ar, std::forward<Args>(next)...);
}